

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_41b1a::logical_combination_error_handler::error
          (logical_combination_error_handler *this,json_pointer *ptr,json *instance,string *message)

{
  pointer *ppeVar1;
  pointer pcVar2;
  pointer peVar3;
  long *plVar4;
  error_entry *peVar5;
  long lVar6;
  ulong uVar7;
  pointer __a;
  _Alloc_hider _Var8;
  error_entry *__args;
  error_entry *extraout_RDX;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer peVar11;
  ulong uVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  error_entry *local_60;
  size_type local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  pointer pbStack_48;
  pointer local_40;
  pointer local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,&ptr->reference_tokens);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_70,instance);
  pcVar2 = (message->_M_dataplus)._M_p;
  local_60 = (error_entry *)&local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + message->_M_string_length);
  peVar3 = (this->error_entry_list_).
           super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (peVar3 == (this->error_entry_list_).
                super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    peVar11 = (this->error_entry_list_).
              super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)peVar3 - (long)peVar11 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    lVar6 = (long)peVar3 - (long)peVar11 >> 3;
    uVar9 = lVar6 * -0x71c71c71c71c71c7;
    uVar7 = 1;
    if (peVar3 != peVar11) {
      uVar7 = uVar9;
    }
    uVar12 = uVar7 + uVar9;
    if (0x1c71c71c71c71c6 < uVar12) {
      uVar12 = 0x1c71c71c71c71c7;
    }
    if (CARRY8(uVar7,uVar9)) {
      uVar12 = 0x1c71c71c71c71c7;
    }
    if (uVar12 == 0) {
      __a = (pointer)0x0;
    }
    else {
      __a = (pointer)operator_new(uVar12 * 0x48);
    }
    plVar4 = (long *)((long)&(__a->ptr_).reference_tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl + lVar6 * 8);
    *plVar4 = (long)local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    plVar4[1] = (long)local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    plVar4[2] = (long)local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(value_t *)(plVar4 + 3) = local_70.m_type;
    *(json_value *)(plVar4 + 4) = local_70.m_value;
    local_70.m_type = null;
    local_70.m_value.object = (object_t *)0x0;
    _Var8._M_p = (__a->message_).field_2._M_local_buf + lVar6 * 8;
    (&(__a->message_)._M_dataplus)[lVar6]._M_p = _Var8._M_p;
    if (local_60 == (error_entry *)&local_50) {
      *(ulong *)_Var8._M_p = CONCAT71(uStack_4f,local_50);
      *(pointer *)((long)&(__a->message_).field_2 + lVar6 * 8 + 8U) = pbStack_48;
    }
    else {
      plVar4[5] = (long)local_60;
      plVar4[7] = CONCAT71(uStack_4f,local_50);
    }
    plVar4[6] = local_58;
    local_58 = 0;
    local_50 = 0;
    peVar5 = (error_entry *)&local_50;
    local_40 = __a;
    local_38 = peVar11;
    if (peVar3 != peVar11) {
      __args = local_60;
      paVar10 = &(peVar11->message_).field_2;
      local_60 = (error_entry *)&local_50;
      do {
        std::
        allocator_traits<std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>>
        ::
        construct<(anonymous_namespace)::logical_combination_error_handler::error_entry,(anonymous_namespace)::logical_combination_error_handler::error_entry>
                  ((allocator_type *)__a,(error_entry *)((long)paVar10 + -0x38),__args);
        plVar4 = (long *)(((string *)(paVar10 + -1))->_M_dataplus)._M_p;
        if (paVar10 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar4) {
          operator_delete(plVar4,paVar10->_M_allocated_capacity + 1);
        }
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)(paVar10 + -2));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)paVar10 + -0x38));
        __a = __a + 1;
        peVar11 = (pointer)(paVar10 + 1);
        __args = extraout_RDX;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar10 + 0x48);
        peVar5 = local_60;
      } while (peVar11 != peVar3);
    }
    local_60 = peVar5;
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38,(long)(this->error_entry_list_).
                                     super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)local_38);
    }
    (this->error_entry_list_).
    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
    ._M_impl.super__Vector_impl_data._M_start = local_40;
    (this->error_entry_list_).
    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = __a + 1;
    (this->error_entry_list_).
    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_40 + uVar12;
    if (local_60 != (error_entry *)&local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
  }
  else {
    (peVar3->ptr_).reference_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_88.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (peVar3->ptr_).reference_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (peVar3->ptr_).reference_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (peVar3->instance_).m_type = local_70.m_type;
    (peVar3->instance_).m_value = local_70.m_value;
    local_70.m_type = null;
    local_70.m_value.object = (object_t *)0x0;
    paVar10 = &(peVar3->message_).field_2;
    (peVar3->message_)._M_dataplus._M_p = (pointer)paVar10;
    if (local_60 == (error_entry *)&local_50) {
      paVar10->_M_allocated_capacity = CONCAT71(uStack_4f,local_50);
      *(pointer *)((long)&(peVar3->message_).field_2 + 8) = pbStack_48;
    }
    else {
      (peVar3->message_)._M_dataplus._M_p = (pointer)local_60;
      (peVar3->message_).field_2._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    }
    (peVar3->message_)._M_string_length = local_58;
    local_58 = 0;
    local_50 = 0;
    ppeVar1 = &(this->error_entry_list_).
               super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppeVar1 = *ppeVar1 + 1;
    local_60 = (error_entry *)&local_50;
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void error(const json::json_pointer &ptr, const json &instance, const std::string &message) override
	{
		error_entry_list_.push_back(error_entry{ptr, instance, message});
	}